

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Approx * __thiscall Catch::Detail::Approx::toString_abi_cxx11_(Approx *this)

{
  ostream *poVar1;
  long in_RSI;
  Catch local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream oss;
  Approx *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Approx( ");
  Catch::toString_abi_cxx11_(local_1c0,*(double *)(in_RSI + 0x10));
  poVar1 = std::operator<<(poVar1,(string *)local_1c0);
  std::operator<<(poVar1," )");
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

std::string toString() const {
            std::ostringstream oss;
            oss << "Approx( " << Catch::toString( m_value ) << " )";
            return oss.str();
        }